

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionFromVector3ToVector3(Vector3 from,Vector3 to)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Quaternion QVar11;
  
  fVar8 = to.z;
  fVar4 = from.z;
  fVar9 = from.x;
  fVar5 = from.y;
  fVar6 = to.x;
  fVar7 = to.y;
  fVar10 = fVar5 * fVar8 - fVar7 * fVar4;
  fVar2 = fVar4 * fVar6 - fVar8 * fVar9;
  fVar3 = fVar9 * fVar7 - fVar6 * fVar5;
  fVar5 = fVar4 * fVar8 + fVar9 * fVar6 + fVar5 * fVar7 + 1.0;
  fVar9 = SQRT(fVar5 * fVar5 + fVar3 * fVar3 + fVar10 * fVar10 + fVar2 * fVar2);
  uVar1 = -(uint)(fVar9 == 0.0);
  fVar9 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar9));
  QVar11.x = fVar9 * fVar10;
  QVar11.y = fVar9 * fVar2;
  QVar11.w = fVar9 * fVar5;
  QVar11.z = fVar9 * fVar3;
  return QVar11;
}

Assistant:

RMAPI Quaternion QuaternionFromVector3ToVector3(Vector3 from, Vector3 to)
{
    Quaternion result = { 0 };

    float cos2Theta = (from.x*to.x + from.y*to.y + from.z*to.z);    // Vector3DotProduct(from, to)
    Vector3 cross = { from.y*to.z - from.z*to.y, from.z*to.x - from.x*to.z, from.x*to.y - from.y*to.x }; // Vector3CrossProduct(from, to)

    result.x = cross.x;
    result.y = cross.y;
    result.z = cross.z;
    result.w = 1.0f + cos2Theta;

    // QuaternionNormalize(q);
    // NOTE: Normalize to essentially nlerp the original and identity to 0.5
    Quaternion q = result;
    float length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}